

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O0

uint32_t farmhashmk::Hash32(char *s,size_t len)

{
  ulong uVar1;
  ulong in_RSI;
  char *in_RDI;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  size_t iters;
  uint32_t a4;
  uint32_t a3;
  uint32_t a2;
  uint32_t a1;
  uint32_t a0;
  uint32_t f;
  uint32_t g;
  uint32_t h;
  uint32_t local_5c;
  uint32_t local_58;
  uint32_t in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  char *local_10;
  uint32_t local_4;
  
  if (in_RSI < 0x19) {
    if (in_RSI < 0xd) {
      if (in_RSI < 5) {
        local_58 = Hash32Len0to4(in_stack_ffffffffffffffc0,
                                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                 in_stack_ffffffffffffffb4);
      }
      else {
        local_58 = Hash32Len5to12(in_stack_ffffffffffffffc0,
                                  CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                  in_stack_ffffffffffffffb4);
      }
      local_5c = local_58;
    }
    else {
      local_5c = Hash32Len13to24(in_stack_ffffffffffffffc0,
                                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                 in_stack_ffffffffffffffb4);
    }
    local_4 = local_5c;
  }
  else {
    util::Fetch32(in_RDI + (in_RSI - 4));
    util::Rotate32(0,0x208406);
    util::Fetch32(in_RDI + (in_RSI - 8));
    util::Rotate32(0,0x208433);
    util::Fetch32(in_RDI + (in_RSI - 0x10));
    util::Rotate32(0,0x208460);
    util::Fetch32(in_RDI + (in_RSI - 0xc));
    util::Rotate32(0,0x20848d);
    util::Fetch32(in_RDI + (in_RSI - 0x14));
    util::Rotate32(0,0x2084ba);
    util::Rotate32(0,0x2084de);
    util::Rotate32(0,0x20850a);
    util::Rotate32(0,0x208536);
    util::Rotate32(0,0x208562);
    util::Rotate32(0,0x20858e);
    uVar1 = (in_RSI - 1) / 0x14;
    local_10 = in_RDI;
    do {
      util::Fetch32(local_10);
      util::Fetch32(local_10 + 4);
      util::Fetch32(local_10 + 8);
      util::Fetch32(local_10 + 0xc);
      util::Fetch32(local_10 + 0x10);
      util::Mur(0,0x208634);
      util::Mur(0,0x208649);
      util::Mur(0,0x208668);
      local_10 = local_10 + 0x14;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
    util::Rotate32(0,0x2086bc);
    util::Rotate32(0,0x2086d4);
    util::Rotate32(0,0x2086ec);
    util::Rotate32(0,0x208704);
    util::Rotate32(0,0x208720);
    util::Rotate32(0,0x208740);
    util::Rotate32(0,0x20875c);
    local_4 = util::Rotate32(0,0x20877c);
    local_4 = local_4 * -0x3361d2af;
  }
  return local_4;
}

Assistant:

uint32_t Hash32(const char *s, size_t len) {
  if (len <= 24) {
    return len <= 12 ?
        (len <= 4 ? Hash32Len0to4(s, len) : Hash32Len5to12(s, len)) :
        Hash32Len13to24(s, len);
  }

  // len > 24
  uint32_t h = len, g = c1 * len, f = g;
  uint32_t a0 = Rotate(Fetch(s + len - 4) * c1, 17) * c2;
  uint32_t a1 = Rotate(Fetch(s + len - 8) * c1, 17) * c2;
  uint32_t a2 = Rotate(Fetch(s + len - 16) * c1, 17) * c2;
  uint32_t a3 = Rotate(Fetch(s + len - 12) * c1, 17) * c2;
  uint32_t a4 = Rotate(Fetch(s + len - 20) * c1, 17) * c2;
  h ^= a0;
  h = Rotate(h, 19);
  h = h * 5 + 0xe6546b64;
  h ^= a2;
  h = Rotate(h, 19);
  h = h * 5 + 0xe6546b64;
  g ^= a1;
  g = Rotate(g, 19);
  g = g * 5 + 0xe6546b64;
  g ^= a3;
  g = Rotate(g, 19);
  g = g * 5 + 0xe6546b64;
  f += a4;
  f = Rotate(f, 19) + 113;
  size_t iters = (len - 1) / 20;
  do {
    uint32_t a = Fetch(s);
    uint32_t b = Fetch(s + 4);
    uint32_t c = Fetch(s + 8);
    uint32_t d = Fetch(s + 12);
    uint32_t e = Fetch(s + 16);
    h += a;
    g += b;
    f += c;
    h = Mur(d, h) + e;
    g = Mur(c, g) + a;
    f = Mur(b + e * c1, f) + d;
    f += g;
    g += f;
    s += 20;
  } while (--iters != 0);
  g = Rotate(g, 11) * c1;
  g = Rotate(g, 17) * c1;
  f = Rotate(f, 11) * c1;
  f = Rotate(f, 17) * c1;
  h = Rotate(h + g, 19);
  h = h * 5 + 0xe6546b64;
  h = Rotate(h, 17) * c1;
  h = Rotate(h + f, 19);
  h = h * 5 + 0xe6546b64;
  h = Rotate(h, 17) * c1;
  return h;
}